

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

Gia_Man_t * Gia_ManFraigSweepSimple(Gia_Man_t *p,void *pPars)

{
  int iVar1;
  Gia_Man_t *p_00;
  
  if (p->pManTime != (void *)0x0) {
    iVar1 = Gia_ManBoxNum(p);
    if (iVar1 != 0) {
      __assert_fail("p->pManTime == NULL || Gia_ManBoxNum(p) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x24a,"Gia_Man_t *Gia_ManFraigSweepSimple(Gia_Man_t *, void *)");
    }
  }
  Gia_ManFraigSweepPerform(p,pPars);
  p_00 = Gia_ManEquivReduce(p,1,0,0,0);
  if (p_00 == (Gia_Man_t *)0x0) {
    p_00 = Gia_ManDup(p);
  }
  Gia_ManTransferTiming(p_00,p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFraigSweepSimple( Gia_Man_t * p, void * pPars )
{
    Gia_Man_t * pNew;
    assert( p->pManTime == NULL || Gia_ManBoxNum(p) == 0 );
    Gia_ManFraigSweepPerform( p, pPars );
    pNew = Gia_ManEquivReduce( p, 1, 0, 0, 0 );
    if ( pNew == NULL )
        pNew = Gia_ManDup(p);
    Gia_ManTransferTiming( pNew, p );
    return pNew;
}